

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int AdjustTree(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell)

{
  int iVar1;
  int local_74;
  undefined1 local_70 [4];
  int iCell;
  RtreeCell cell;
  RtreeNode *pParent;
  RtreeCoord *pRStack_30;
  int cnt;
  RtreeNode *p;
  RtreeCell *pCell_local;
  RtreeNode *pNode_local;
  Rtree *pRtree_local;
  
  pParent._4_4_ = 0;
  pRStack_30 = (RtreeCoord *)pNode;
  while( true ) {
    if (*(long *)pRStack_30 == 0) {
      return 0;
    }
    cell.aCoord._32_8_ = *(undefined8 *)pRStack_30;
    pParent._4_4_ = pParent._4_4_ + 1;
    if ((1000 < pParent._4_4_) ||
       (iVar1 = nodeParentIndex(pRtree,(RtreeNode *)pRStack_30,&local_74), iVar1 != 0)) break;
    nodeGetCell(pRtree,(RtreeNode *)cell.aCoord._32_8_,local_74,(RtreeCell *)local_70);
    iVar1 = cellContains(pRtree,(RtreeCell *)local_70,pCell);
    if (iVar1 == 0) {
      cellUnion(pRtree,(RtreeCell *)local_70,pCell);
      nodeOverwriteCell(pRtree,(RtreeNode *)cell.aCoord._32_8_,(RtreeCell *)local_70,local_74);
    }
    pRStack_30 = (RtreeCoord *)cell.aCoord._32_8_;
  }
  return 0x10b;
}

Assistant:

static int AdjustTree(
  Rtree *pRtree,                    /* Rtree table */
  RtreeNode *pNode,                 /* Adjust ancestry of this node. */
  RtreeCell *pCell                  /* This cell was just inserted */
){
  RtreeNode *p = pNode;
  int cnt = 0;
  while( p->pParent ){
    RtreeNode *pParent = p->pParent;
    RtreeCell cell;
    int iCell;

    if( (++cnt)>1000 || nodeParentIndex(pRtree, p, &iCell)  ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }

    nodeGetCell(pRtree, pParent, iCell, &cell);
    if( !cellContains(pRtree, &cell, pCell) ){
      cellUnion(pRtree, &cell, pCell);
      nodeOverwriteCell(pRtree, pParent, &cell, iCell);
    }
 
    p = pParent;
  }
  return SQLITE_OK;
}